

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

bool duckdb::ApproxQuantileCoding::Decode<double,long>(double *source,long *target)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = duckdb::TryCast::Operation<double,long>(*source,target,false);
  if (!bVar1) {
    lVar2 = -0x8000000000000000;
    if (0.0 < *source || *source == 0.0) {
      lVar2 = 0x7fffffffffffffff;
    }
    *target = lVar2;
  }
  return bVar1;
}

Assistant:

static bool Decode(const SAVE_TYPE &source, TARGET_TYPE &target) {
		// The result is approximate, so clamp instead of overflowing.
		if (TryCast::Operation(source, target, false)) {
			return true;
		} else if (source < 0) {
			target = NumericLimits<TARGET_TYPE>::Minimum();
		} else {
			target = NumericLimits<TARGET_TYPE>::Maximum();
		}
		return false;
	}